

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

void __thiscall HEkk::debugReporting(HEkk *this,HighsInt save_mod_recover,HighsInt log_dev_level_)

{
  HighsOptions *pHVar1;
  
  if (save_mod_recover == 0) {
    pHVar1 = this->options_;
    (pHVar1->super_HighsOptionsStruct).output_flag = true;
    (pHVar1->super_HighsOptionsStruct).log_dev_level = log_dev_level_;
    (pHVar1->super_HighsOptionsStruct).highs_debug_level = 2;
    (pHVar1->super_HighsOptionsStruct).highs_analysis_level = 4;
    if (log_dev_level_ == 3) {
      (this->analysis_).analyse_simplex_runtime_data = true;
      return;
    }
  }
  else {
    if (save_mod_recover == -1) {
      pHVar1 = this->options_;
      debugReporting::output_flag = (pHVar1->super_HighsOptionsStruct).output_flag;
      debugReporting::log_dev_level = (pHVar1->super_HighsOptionsStruct).log_dev_level;
      debugReporting::highs_analysis_level = (pHVar1->super_HighsOptionsStruct).highs_analysis_level
      ;
      debugReporting::highs_debug_level = (pHVar1->super_HighsOptionsStruct).highs_debug_level;
      debugReporting::analyse_simplex_runtime_data = (this->analysis_).analyse_simplex_runtime_data;
      return;
    }
    pHVar1 = this->options_;
    (pHVar1->super_HighsOptionsStruct).output_flag = debugReporting::output_flag;
    (pHVar1->super_HighsOptionsStruct).log_dev_level = debugReporting::log_dev_level;
    (pHVar1->super_HighsOptionsStruct).highs_analysis_level = debugReporting::highs_analysis_level;
    (pHVar1->super_HighsOptionsStruct).highs_debug_level = debugReporting::highs_debug_level;
    (this->analysis_).analyse_simplex_runtime_data = debugReporting::analyse_simplex_runtime_data;
  }
  return;
}

Assistant:

void HEkk::debugReporting(const HighsInt save_mod_recover,
                          const HighsInt log_dev_level_) {
  static bool output_flag;
  static HighsInt log_dev_level;
  static HighsInt highs_analysis_level;
  static HighsInt highs_debug_level;
  static bool analyse_simplex_runtime_data;
  if (save_mod_recover == -1) {
    output_flag = options_->output_flag;
    log_dev_level = options_->log_dev_level;
    highs_analysis_level = options_->highs_analysis_level;
    highs_debug_level = options_->highs_debug_level;
    analyse_simplex_runtime_data = analysis_.analyse_simplex_runtime_data;
  } else if (save_mod_recover == 0) {
    this->options_->output_flag = true;
    this->options_->log_dev_level = log_dev_level_;
    this->options_->highs_analysis_level =
        //        kHighsAnalysisLevelSolverSummaryData +
        kHighsAnalysisLevelSolverRuntimeData;
    this->options_->highs_debug_level = kHighsDebugLevelCostly;
    if (log_dev_level_ == kHighsLogDevLevelVerbose)
      this->analysis_.analyse_simplex_runtime_data = true;
  } else {
    options_->output_flag = output_flag;
    options_->log_dev_level = log_dev_level;
    options_->highs_analysis_level = highs_analysis_level;
    options_->highs_debug_level = highs_debug_level;
    analysis_.analyse_simplex_runtime_data = analyse_simplex_runtime_data;
  }
}